

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cpp
# Opt level: O3

ptr __thiscall
chatter::Peer::ack_packet(Peer *this,ProtocolChannelID channel_id,SeqNum sequence_num)

{
  int iVar1;
  iterator __position;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined7 in_register_00000031;
  _List_node_base *this_01;
  ptr pVar4;
  
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(in_register_00000014,sequence_num);
  this->m_state = DISCONNECTED;
  this->m_id = 0;
  (this->m_address).m_address = 0;
  (this->m_address).m_port = 0;
  *(undefined2 *)&(this->m_address).field_0x6 = 0;
  if ((byte)sequence_num < 0x21) {
    this_01 = (_List_node_base *)
              (CONCAT71(in_register_00000031,channel_id) + (ulong)((sequence_num & 0xff) << 5) +
              0x50);
    for (__position._M_node = this_01->_M_next; __position._M_node != this_01;
        __position._M_node = (__position._M_node)->_M_next) {
      p_Var2 = __position._M_node[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__position._M_node[1]._M_prev;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar1 = *(int *)((long)&p_Var2[4]._M_next + 4);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        iVar1 = *(int *)((long)&p_Var2[4]._M_next + 4);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var3._M_pi = extraout_RDX;
      }
      if (iVar1 == in_ECX) break;
    }
    if (__position._M_node != this_01) {
      *(_List_node_base **)this = __position._M_node[1]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_address,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__position._M_node[1]._M_prev);
      std::__cxx11::
      list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>::
      _M_erase((list<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                *)this_01,__position);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  pVar4.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr)pVar4.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Packet::ptr Peer::ack_packet(ProtocolChannelID channel_id, SeqNum sequence_num)
{
    /* 0 -> 31 are ordered channels, 32 is used for unordered reliable */
    if (channel_id > 32)
        return nullptr;

    Packet::ptr packet = nullptr;
    ProtocolChannel& chan = m_channels[channel_id];

    std::list<Packet::ptr>::iterator itr;
    itr = std::find_if(
            chan.sent_reliable.begin(),
            chan.sent_reliable.end(),
            [&](Packet::ptr p){return p->m_sequence_num == sequence_num;}
        );

    if (itr != chan.sent_reliable.end()) {
        /* Found the packet! */
        packet = *itr;
        chan.sent_reliable.erase(itr);
    }

    return packet;
}